

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O3

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitIf
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,If *curr)

{
  BinaryInstWriter *this_00;
  
  this_00 = (BinaryInstWriter *)(this + 2);
  BinaryInstWriter::visit(this_00,(Expression *)curr);
  visitPossibleBlockContents(this,curr->ifTrue);
  if (curr->ifFalse != (Expression *)0x0) {
    BinaryInstWriter::emitIfElse(this_00,curr);
    visitPossibleBlockContents(this,curr->ifFalse);
  }
  BinaryInstWriter::emitScopeEnd(this_00,(Expression *)curr);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id == 1) {
    if (curr->ifFalse != (Expression *)0x0) {
      BinaryInstWriter::emitUnreachable(this_00);
      return;
    }
    __assert_fail("curr->ifFalse",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-stack.h"
                  ,0x18c,
                  "void wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitIf(If *) [SubType = wasm::BinaryenIRToBinaryWriter]"
                 );
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitIf(If* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->ifTrue);

  if (curr->ifFalse) {
    emitIfElse(curr);
    visitPossibleBlockContents(curr->ifFalse);
  }

  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // We already handled the case of the condition being unreachable in
    // `visit`.  Otherwise, we may still be unreachable, if we are an if-else
    // with both sides unreachable. Just like with blocks, we emit an extra
    // `unreachable` to work around potential type mismatches.
    assert(curr->ifFalse);
    emitUnreachable();
  }
}